

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O1

ExpandMacroResult __thiscall
anon_unknown.dwarf_7a8b67::EnvironmentMacroExpander::operator()
          (EnvironmentMacroExpander *this,string *macroNamespace,string *macroName,string *macroOut,
          int param_4)

{
  int iVar1;
  ExpandMacroResult EVar2;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> value;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_40;
  bool local_20;
  
  iVar1 = std::__cxx11::string::compare((char *)macroNamespace);
  EVar2 = Ignore;
  if (iVar1 == 0) {
    if (macroName->_M_string_length == 0) {
      EVar2 = Error;
    }
    else {
      cmSystemTools::GetEnvVar
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,macroName);
      if (local_20 == true) {
        std::__cxx11::string::_M_append((char *)macroOut,(ulong)local_40._M_value._M_dataplus._M_p);
      }
      if (local_20 == true) {
        local_20 = false;
        if (local_40._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_40._M_value + 0x10)) {
          operator_delete((void *)local_40._M_value._M_dataplus._M_p,local_40._16_8_ + 1);
        }
      }
      EVar2 = Ok;
    }
  }
  return EVar2;
}

Assistant:

ExpandMacroResult operator()(const std::string& macroNamespace,
                               const std::string& macroName,
                               std::string& macroOut,
                               int /*version*/) const override
  {
    if (macroNamespace == "penv") {
      if (macroName.empty()) {
        return ExpandMacroResult::Error;
      }
      if (cm::optional<std::string> value =
            cmSystemTools::GetEnvVar(macroName)) {
        macroOut += *value;
      }
      return ExpandMacroResult::Ok;
    }

    return ExpandMacroResult::Ignore;
  }